

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void check_op<std::less>(void)

{
  basic_string_view<char> other;
  bool bVar1;
  AssertionResult gtest_ar;
  string_view rhs;
  string_view lhs;
  size_t j;
  size_t i;
  size_t num_inputs;
  char *inputs [3];
  char *in_stack_ffffffffffffff58;
  basic_string_view<char> *in_stack_ffffffffffffff60;
  bool *in_stack_ffffffffffffff68;
  basic_string_view<char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Type type;
  AssertHelper *this;
  int local_68;
  less<int> local_62;
  undefined1 local_61;
  AssertionResult local_60;
  char *local_50;
  AssertHelper *local_48;
  AssertHelper *local_30;
  AssertHelper *message;
  AssertHelper *this_00;
  
  this_00 = (AssertHelper *)0x3;
  for (message = (AssertHelper *)0x0; message < this_00;
      message = (AssertHelper *)
                ((long)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&message->data_)->ptr_ + 1)) {
    for (local_30 = (AssertHelper *)0x0; local_30 < this_00;
        local_30 = (AssertHelper *)
                   ((long)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_30->data_)->ptr_ + 1)) {
      fmt::v5::basic_string_view<char>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      fmt::v5::basic_string_view<char>::basic_string_view
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      type = (Type)((ulong)local_50 >> 0x20);
      other.size_ = (size_t)local_48;
      other.data_ = local_50;
      this = local_48;
      local_68 = fmt::v5::basic_string_view<char>::compare
                           ((basic_string_view<char> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),other);
      in_stack_ffffffffffffff84 = 0;
      local_61 = std::less<int>::operator()(&local_62,&local_68,(int *)&stack0xffffffffffffff84);
      bVar1 = std::less<fmt::v5::basic_string_view<char>_>::operator()
                        ((less<fmt::v5::basic_string_view<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (basic_string_view<char> *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff80 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff80);
      testing::internal::EqHelper<false>::Compare<bool,bool>
                ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (bool *)in_stack_ffffffffffffff60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
      if (!bVar1) {
        testing::Message::Message((Message *)this);
        in_stack_ffffffffffffff58 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12a9e4);
        testing::internal::AssertHelper::AssertHelper
                  (this,type,(char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,(char *)in_stack_ffffffffffffff70);
        testing::internal::AssertHelper::operator=(this_00,(Message *)message);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff60);
        testing::Message::~Message((Message *)0x12aa30);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12aa80);
    }
  }
  return;
}

Assistant:

void check_op() {
  const char *inputs[] = {"foo", "fop", "fo"};
  std::size_t num_inputs = sizeof(inputs) / sizeof(*inputs);
  for (std::size_t i = 0; i < num_inputs; ++i) {
    for (std::size_t j = 0; j < num_inputs; ++j) {
      string_view lhs(inputs[i]), rhs(inputs[j]);
      EXPECT_EQ(Op<int>()(lhs.compare(rhs), 0), Op<string_view>()(lhs, rhs));
    }
  }
}